

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

void __thiscall
CTxMemPoolEntry::UpdateDescendantState
          (CTxMemPoolEntry *this,int32_t modifySize,CAmount modifyFee,int64_t modifyCount)

{
  int64_t *piVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  piVar1 = &this->nSizeWithDescendants;
  lVar3 = *piVar1;
  *piVar1 = *piVar1 + (long)modifySize;
  if (*piVar1 == 0 || SCARRY8(lVar3,(long)modifySize) != *piVar1 < 0) {
    __assert_fail("nSizeWithDescendants > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txmempool.cpp"
                  ,0x17f,"void CTxMemPoolEntry::UpdateDescendantState(int32_t, CAmount, int64_t)");
  }
  lVar3 = SaturatingAdd<long>(this->nModFeesWithDescendants,modifyFee);
  this->nModFeesWithDescendants = lVar3;
  piVar1 = &this->m_count_with_descendants;
  lVar3 = *piVar1;
  *piVar1 = *piVar1 + modifyCount;
  if (*piVar1 != 0 && SCARRY8(lVar3,modifyCount) == *piVar1 < 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("m_count_with_descendants > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txmempool.cpp"
                ,0x182,"void CTxMemPoolEntry::UpdateDescendantState(int32_t, CAmount, int64_t)");
}

Assistant:

void CTxMemPoolEntry::UpdateDescendantState(int32_t modifySize, CAmount modifyFee, int64_t modifyCount)
{
    nSizeWithDescendants += modifySize;
    assert(nSizeWithDescendants > 0);
    nModFeesWithDescendants = SaturatingAdd(nModFeesWithDescendants, modifyFee);
    m_count_with_descendants += modifyCount;
    assert(m_count_with_descendants > 0);
}